

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape.h
# Opt level: O3

void __thiscall
Gudhi::Persistence_representations::Persistence_landscape::print_to_file
          (Persistence_landscape *this,char *filename)

{
  ostream *poVar1;
  long lVar2;
  pointer pvVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ofstream write;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230);
  std::ofstream::open((char *)&local_230,(_Ios_Openmode)filename);
  if ((this->land).
      super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->land).
      super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar6 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"#lambda_",8);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      pvVar3 = (this->land).
               super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar2 = *(long *)&pvVar3[lVar6].
                        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                        ._M_impl;
      if ((long)*(pointer *)
                 ((long)&pvVar3[lVar6].
                         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         ._M_impl + 8) - lVar2 != 0x20) {
        lVar4 = 0;
        lVar5 = 0;
        do {
          poVar1 = std::ostream::_M_insert<double>(*(double *)(lVar2 + 0x10 + lVar4));
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
          poVar1 = std::ostream::_M_insert<double>
                             (*(double *)
                               (*(long *)&(this->land).
                                          super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[lVar6].
                                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                          ._M_impl + 0x18 + lVar4));
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
          std::ostream::put((char)poVar1);
          std::ostream::flush();
          pvVar3 = (this->land).
                   super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar2 = *(long *)&pvVar3[lVar6].
                            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                            ._M_impl;
          lVar5 = lVar5 + 1;
          lVar4 = lVar4 + 0x10;
        } while (lVar5 != ((long)*(pointer *)
                                  ((long)&pvVar3[lVar6].
                                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                          ._M_impl + 8) - lVar2 >> 4) + -2);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != ((long)(this->land).
                             super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
                      -0x5555555555555555);
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void Persistence_landscape::print_to_file(const char* filename) const {
  std::ofstream write;
  write.open(filename);
  for (size_t dim = 0; dim != this->land.size(); ++dim) {
    write << "#lambda_" << dim << std::endl;
    for (size_t i = 1; i != this->land[dim].size() - 1; ++i) {
      write << this->land[dim][i].first << "  " << this->land[dim][i].second << std::endl;
    }
  }
  write.close();
}